

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O3

void Str_MuxTraverse_rec(Gia_Man_t *p,int i)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  uint *puVar3;
  uint uVar4;
  
  if (i < p->nTravIdsAlloc) {
    do {
      if (p->pTravIds[i] == p->nTravIds) {
        return;
      }
      p->pTravIds[i] = p->nTravIds;
      if ((i < 0) || (p->nObjs <= i)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar4 = (uint)*(undefined8 *)(p->pObjs + i);
      if ((int)uVar4 < 0) {
        return;
      }
      if ((uVar4 & 0x1fffffff) == 0x1fffffff) {
        return;
      }
      pGVar1 = p->pObjs + i;
      Str_MuxTraverse_rec(p,i - (uVar4 & 0x1fffffff));
      Str_MuxTraverse_rec(p,i - (*(uint *)&pGVar1->field_0x4 & 0x1fffffff));
      pGVar2 = p->pObjs;
      if ((pGVar1 < pGVar2) || (pGVar2 + p->nObjs <= pGVar1)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      puVar3 = p->pMuxes;
      if (puVar3 == (uint *)0x0) {
        return;
      }
      if (puVar3[(int)((ulong)((long)pGVar1 - (long)pGVar2) >> 2) * -0x55555555] == 0) {
        return;
      }
      uVar4 = puVar3[i];
      if (uVar4 == 0) {
        i = 0xffffffff;
      }
      else {
        if ((int)uVar4 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        i = uVar4 >> 1;
      }
    } while (i < p->nTravIdsAlloc);
  }
  __assert_fail("Id < p->nTravIdsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x267,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
}

Assistant:

void Str_MuxTraverse_rec( Gia_Man_t * p, int i )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, i) )
        return;
    Gia_ObjSetTravIdCurrentId(p, i);
    pObj = Gia_ManObj(p, i);
    if ( !Gia_ObjIsAnd(pObj) )
        return;
    Str_MuxTraverse_rec(p, Gia_ObjFaninId0(pObj, i) );
    Str_MuxTraverse_rec(p, Gia_ObjFaninId1(pObj, i) );
    if ( Gia_ObjIsMux(p, pObj) )
        Str_MuxTraverse_rec(p, Gia_ObjFaninId2(p, i) );
}